

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yssimplesound.cpp
# Opt level: O0

YSRESULT __thiscall YsSoundPlayer::SoundData::LoadWav(SoundData *this,BinaryInStream *inStream)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  uchar *puVar8;
  ushort local_160;
  uint local_15c;
  unsigned_short cbSize;
  unsigned_short wBitsPerSample;
  unsigned_short nBlockAlign;
  uint nAvgBytesPerSec;
  uint nSamplesPerSec;
  unsigned_short nChannels;
  unsigned_short wFormatTag;
  uint dataSize;
  uint hdrSize;
  uint fSize;
  uint l;
  uchar buf [256];
  BinaryInStream *inStream_local;
  SoundData *this_local;
  
  CleanUp(this);
  iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
  if (CONCAT44(extraout_var,iVar1) == 4) {
    iVar1 = strncmp((char *)&fSize,"RIFF",4);
    if (iVar1 != 0) {
      printf("Warning: RIFF not found.\n");
    }
    iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
    if (CONCAT44(extraout_var_00,iVar1) == 4) {
      uVar2 = GetUnsigned((uchar *)&fSize);
      printf("File Size=%d\n",(ulong)(uVar2 + 8));
      iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,8);
      if (CONCAT44(extraout_var_01,iVar1) == 8) {
        iVar1 = strncmp((char *)&fSize,"WAVEfmt",7);
        if (iVar1 != 0) {
          printf("Warning: WAVEfmt not found\n");
        }
        iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
        if (CONCAT44(extraout_var_02,iVar1) == 4) {
          uVar2 = GetUnsigned((uchar *)&fSize);
          printf("Header Size=%d\n",(ulong)uVar2);
          iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,(ulong)uVar2);
          if (CONCAT44(extraout_var_03,iVar1) == (ulong)uVar2) {
            uVar3 = GetUnsignedShort((uchar *)&fSize);
            uVar4 = GetUnsignedShort((uchar *)((long)&fSize + 2));
            uVar5 = GetUnsigned((uchar *)&l);
            uVar6 = GetUnsigned(buf);
            uVar7 = GetUnsignedShort(buf + 4);
            if (uVar2 < 0x10) {
              local_15c = 0;
            }
            else {
              local_15c = GetUnsignedShort(buf + 6);
            }
            if (uVar2 < 0x12) {
              local_160 = 0;
            }
            else {
              uVar2 = GetUnsignedShort(buf + 8);
              local_160 = (ushort)uVar2;
            }
            printf("wFormatTag=%d\n",(ulong)(ushort)uVar3);
            printf("nChannels=%d\n",(ulong)(ushort)uVar4);
            printf("nSamplesPerSec=%d\n",(ulong)uVar5);
            printf("nAvgBytesPerSec=%d\n",(ulong)uVar6);
            printf("nBlockAlign=%d\n",(ulong)(ushort)uVar7);
            printf("wBitsPerSample=%d\n",(ulong)(ushort)local_15c);
            printf("cbSize=%d\n",(ulong)local_160);
            do {
              iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
              if (CONCAT44(extraout_var_04,iVar1) != 4) {
                printf("Error while waiting for data.\n");
                return YSERR;
              }
              if ((((((byte)fSize == 100) || ((byte)fSize == 0x44)) &&
                   ((fSize._1_1_ == 0x61 || (fSize._1_1_ == 0x41)))) &&
                  ((fSize._2_1_ == 0x74 || (fSize._2_1_ == 0x54)))) &&
                 ((fSize._3_1_ == 0x61 || (fSize._3_1_ == 0x41)))) {
                iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
                if (CONCAT44(extraout_var_07,iVar1) != 4) {
                  printf("Error in reading data size.\n");
                  return YSERR;
                }
                uVar2 = GetUnsigned((uchar *)&fSize);
                printf("Data Size=%d (0x%x)\n",(ulong)uVar2,(ulong)uVar2);
                puVar8 = (uchar *)operator_new__((ulong)uVar2);
                this->dat = puVar8;
                uVar3 = (**inStream->_vptr_BinaryInStream)(inStream,this->dat,(ulong)uVar2);
                if (uVar3 != uVar2) {
                  printf("Warning: File ended before reading all data.\n");
                  printf("  %d (0x%x) bytes have been read\n",(ulong)uVar3,(ulong)uVar3);
                }
                this->stereo = (uint)((ushort)uVar4 == 2);
                this->bit = local_15c & 0xffff;
                this->sizeInBytes = uVar2;
                this->rate = uVar5;
                if ((ushort)local_15c == 8) {
                  this->isSigned = YSFALSE;
                }
                else {
                  this->isSigned = YSTRUE;
                }
                return YSOK;
              }
              printf("Skipping %c%c%c%c (Unknown Block)\n",(ulong)(byte)fSize,(ulong)fSize._1_1_,
                     (ulong)fSize._2_1_,(ulong)fSize._3_1_);
              iVar1 = (**inStream->_vptr_BinaryInStream)(inStream,&fSize,4);
              if (CONCAT44(extraout_var_05,iVar1) != 4) {
                printf("Error while skipping unknown block.\n");
                return YSERR;
              }
              uVar2 = GetUnsigned((uchar *)&fSize);
              iVar1 = (*inStream->_vptr_BinaryInStream[1])(inStream,(ulong)uVar2);
            } while (CONCAT44(extraout_var_06,iVar1) == (ulong)uVar2);
            printf("Error while skipping unknown block.\n");
          }
          else {
            printf("Error in reading header.\n");
          }
        }
        else {
          printf("Error in reading header size.\n");
        }
      }
      else {
        printf("Error in reading WAVEfmt.\n");
      }
    }
    else {
      printf("Error in reading file size.\n");
    }
  }
  else {
    printf("Error in reading RIFF.\n");
  }
  return YSERR;
}

Assistant:

YSRESULT YsSoundPlayer::SoundData::LoadWav(BinaryInStream &inStream)
{
	CleanUp();

	unsigned char buf[256];
	unsigned int l;
	unsigned int fSize,hdrSize,dataSize;

	// Wave Header
	unsigned short wFormatTag,nChannels;
	unsigned nSamplesPerSec,nAvgBytesPerSec;
	unsigned short nBlockAlign,wBitsPerSample,cbSize;


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading RIFF.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"RIFF",4)!=0)
	{
		printf("Warning: RIFF not found.\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading file size.\n");
		return YSERR;
	}
	fSize=GetUnsigned(buf);
	printf("File Size=%d\n",fSize+8);
	// Wait, is it fSize+12?  A new theory tells that "fmt " immediately following "WAVE"
	// is a chunk???

	if(inStream.Fetch(buf,8)!=8)
	{
		printf("Error in reading WAVEfmt.\n");
		return YSERR;
	}
	if(strncmp((char *)buf,"WAVEfmt",7)!=0)
	{
		printf("Warning: WAVEfmt not found\n");
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading header size.\n");
		return YSERR;
	}
	hdrSize=GetUnsigned(buf);
	printf("Header Size=%d\n",hdrSize);


	//    WORD  wFormatTag; 
	//    WORD  nChannels; 
	//    DWORD nSamplesPerSec; 
	//    DWORD nAvgBytesPerSec; 
	//    WORD  nBlockAlign; 
	//    WORD  wBitsPerSample; 
	//    WORD  cbSize; 
	if(inStream.Fetch(buf,hdrSize)!=hdrSize)
	{
		printf("Error in reading header.\n");
		return YSERR;
	}
	wFormatTag=GetUnsignedShort(buf);
	nChannels=GetUnsignedShort(buf+2);
	nSamplesPerSec=GetUnsigned(buf+4);
	nAvgBytesPerSec=GetUnsigned(buf+8);
	nBlockAlign=GetUnsignedShort(buf+12);
	wBitsPerSample=(hdrSize>=16 ? GetUnsignedShort(buf+14) : 0);
	cbSize=(hdrSize>=18 ? GetUnsignedShort(buf+16) : 0);

	printf("wFormatTag=%d\n",wFormatTag);
	printf("nChannels=%d\n",nChannels);
	printf("nSamplesPerSec=%d\n",nSamplesPerSec);
	printf("nAvgBytesPerSec=%d\n",nAvgBytesPerSec);
	printf("nBlockAlign=%d\n",nBlockAlign);
	printf("wBitsPerSample=%d\n",wBitsPerSample);
	printf("cbSize=%d\n",cbSize);



	for(;;)
	{
		if(inStream.Fetch(buf,4)!=4)
		{
			printf("Error while waiting for data.\n");
			return YSERR;
		}

		if((buf[0]=='d' || buf[0]=='D') && (buf[1]=='a' || buf[1]=='A') &&
		   (buf[2]=='t' || buf[2]=='T') && (buf[3]=='a' || buf[3]=='A'))
		{
			break;
		}
		else
		{
			printf("Skipping %c%c%c%c (Unknown Block)\n",buf[0],buf[1],buf[2],buf[3]);
			if(inStream.Fetch(buf,4)!=4)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}



			l=GetUnsigned(buf);
			if(inStream.Skip(l)!=l)
			{
				printf("Error while skipping unknown block.\n");
				return YSERR;
			}
		}
	}


	if(inStream.Fetch(buf,4)!=4)
	{
		printf("Error in reading data size.\n");
		return YSERR;
	}
	dataSize=GetUnsigned(buf);
	printf("Data Size=%d (0x%x)\n",dataSize,dataSize);

	dat=new unsigned char [dataSize];
	if((l=inStream.Fetch(dat,dataSize))!=dataSize)
	{
		printf("Warning: File ended before reading all data.\n");
		printf("  %d (0x%x) bytes have been read\n",l,l);
	}

	this->stereo=(nChannels==2 ? YSTRUE : YSFALSE);
	this->bit=wBitsPerSample;
	this->sizeInBytes=dataSize;
	this->rate=nSamplesPerSec;

	if(wBitsPerSample==8)
	{
		isSigned=YSFALSE;
	}
	else
	{
		isSigned=YSTRUE;
	}

	return YSOK;
}